

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_freelist_save(MDB_txn *txn)

{
  MDB_env *pMVar1;
  MDB_ID MVar2;
  MDB_pgstate *pMVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  MDB_ID *xidl;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  MDB_page *mp;
  ulong uVar10;
  MDB_page *pMVar11;
  MDB_ID *pMVar12;
  MDB_ID MVar13;
  ulong uVar14;
  MDB_ID MVar15;
  long lVar16;
  MDB_IDL pMVar17;
  MDB_IDL ids;
  MDB_val key;
  MDB_val data;
  txnid_t head_id;
  txnid_t id;
  MDB_cursor mc;
  MDB_val local_220;
  MDB_val local_210;
  txnid_t local_200;
  int local_1f4;
  MDB_ID local_1f0;
  uint32_t local_1e4;
  MDB_pgstate *local_1e0;
  long local_1d8;
  long local_1d0;
  txnid_t *local_1c8;
  ulong local_1c0;
  MDB_cursor local_1b8;
  
  pMVar1 = txn->mt_env;
  iVar5 = pMVar1->me_maxfree_1pg;
  local_200 = 0;
  mdb_cursor_init(&local_1b8,txn,0,(MDB_xcursor *)0x0);
  if ((pMVar1->me_pgstate).mf_pghead != (pgno_t *)0x0) {
    iVar4 = mdb_page_search(&local_1b8,(MDB_val *)0x0,5);
    if ((iVar4 != 0) && (iVar4 != -0x784e)) {
      return iVar4;
    }
    if ((pMVar1->me_pgstate).mf_pghead != (pgno_t *)0x0) goto LAB_00106b54;
  }
  pMVar11 = txn->mt_loose_pgs;
  if (pMVar11 != (MDB_page *)0x0) {
    iVar4 = mdb_midl_need(&txn->mt_free_pgs,txn->mt_loose_count);
    if (iVar4 != 0) {
      return iVar4;
    }
    pMVar17 = txn->mt_free_pgs;
    do {
      MVar15 = *pMVar17;
      *pMVar17 = MVar15 + 1;
      *(anon_union_8_2_b62042e6_for_mp_p *)(pMVar17 + MVar15 + 1) = pMVar11->mp_p;
      pMVar11 = pMVar11[2].mp_p.p_next;
    } while (pMVar11 != (MDB_page *)0x0);
    txn->mt_loose_pgs = (MDB_page *)0x0;
    txn->mt_loose_count = 0;
  }
LAB_00106b54:
  local_1e4 = pMVar1->me_flags;
  local_1d0 = (long)(iVar5 + 1);
  local_1c8 = &txn->mt_txnid;
  local_1f4 = 1;
  uVar14 = 0;
  uVar10 = 0;
  uVar9 = 0;
  MVar15 = 0;
  lVar16 = (long)iVar5;
  local_1e0 = &pMVar1->me_pgstate;
  do {
    while( true ) {
      if (uVar9 < (pMVar1->me_pgstate).mf_pglast) {
        do {
          iVar5 = mdb_cursor_first(&local_1b8,&local_220,(MDB_val *)0x0);
          if (iVar5 != 0) {
            return iVar5;
          }
          uVar9 = *local_220.mv_data;
          local_200 = uVar9;
          if ((pMVar1->me_pgstate).mf_pglast < uVar9) {
            mdb_assert_fail(txn->mt_env,"pglast <= env->me_pglast","mdb_freelist_save",(char *)0xd0e
                            ,(int)uVar14);
          }
          iVar5 = mdb_cursor_del(&local_1b8,0);
          if (iVar5 != 0) {
            return iVar5;
          }
        } while (uVar9 < (pMVar1->me_pgstate).mf_pglast);
        uVar14 = 0;
        MVar15 = 0;
      }
      pMVar3 = local_1e0;
      if (*txn->mt_free_pgs <= uVar10) break;
      local_1f0 = MVar15;
      if (((uVar10 == 0) && (iVar5 = mdb_page_search(&local_1b8,(MDB_val *)0x0,9), iVar5 != 0)) &&
         (iVar5 != -0x784e)) {
        return iVar5;
      }
      local_220.mv_size = 8;
      local_220.mv_data = local_1c8;
      uVar7 = *txn->mt_free_pgs;
      local_1d8 = lVar16;
      do {
        uVar10 = uVar7;
        local_210.mv_size = uVar10 * 8 + 8;
        iVar5 = mdb_cursor_put(&local_1b8,&local_220,&local_210,0x10000);
        if (iVar5 != 0) {
          return iVar5;
        }
        pMVar17 = txn->mt_free_pgs;
        uVar7 = *pMVar17;
      } while (uVar10 < *pMVar17);
      mdb_midl_sort(pMVar17);
      memcpy(local_210.mv_data,pMVar17,local_210.mv_size);
      MVar15 = local_1f0;
      lVar16 = local_1d8;
    }
    pMVar17 = local_1e0->mf_pghead;
    if (pMVar17 == (MDB_IDL)0x0) {
      MVar13 = 0;
    }
    else {
      MVar13 = *pMVar17;
    }
    uVar6 = txn->mt_loose_count;
    MVar13 = MVar13 + (long)(int)uVar6;
    if ((long)MVar15 < (long)MVar13) {
      if (1 < local_200 && lVar16 <= (long)uVar14) {
        local_200 = local_200 - 1;
        uVar14 = 0;
      }
    }
    else {
      if ((MVar15 == MVar13) || (local_1f4 < 1)) {
        pMVar11 = txn->mt_loose_pgs;
        if (pMVar11 != (MDB_page *)0x0) {
          iVar5 = mdb_midl_need(&local_1e0->mf_pghead,uVar6 * 2 + 1);
          if (iVar5 != 0) {
            return iVar5;
          }
          pMVar17 = pMVar3->mf_pghead;
          ids = pMVar17 + (pMVar17[-1] - (ulong)uVar6);
          uVar6 = 1;
          do {
            uVar9 = (ulong)uVar6;
            *(anon_union_8_2_b62042e6_for_mp_p *)(ids + uVar9) = pMVar11->mp_p;
            pMVar11 = pMVar11[2].mp_p.p_next;
            uVar6 = uVar6 + 1;
          } while (pMVar11 != (MDB_page *)0x0);
          *ids = uVar9;
          mdb_midl_sort(ids);
          mdb_midl_xmerge(pMVar17,ids);
          txn->mt_loose_pgs = (MDB_page *)0x0;
          txn->mt_loose_count = 0;
          MVar13 = *pMVar17;
        }
        if (MVar13 == 0) {
          return 0;
        }
        iVar5 = mdb_cursor_first(&local_1b8,&local_220,&local_210);
        if (iVar5 != 0) {
          return iVar5;
        }
        pMVar12 = pMVar17 + MVar13;
        while( true ) {
          local_1c0 = *local_220.mv_data;
          if ((local_210.mv_size < 8) || ((pMVar1->me_pgstate).mf_pglast < local_1c0)) {
            mdb_assert_fail(txn->mt_env,"len >= 0 && id <= env->me_pglast","mdb_freelist_save",
                            (char *)0xd82,(int)uVar14);
          }
          MVar15 = (local_210.mv_size >> 3) - 1;
          local_220.mv_data = &local_1c0;
          if ((long)MVar13 < (long)MVar15) {
            local_210.mv_size = MVar13 * 8 + 8;
            MVar15 = MVar13;
          }
          pMVar12 = pMVar12 + -MVar15;
          MVar2 = *pMVar12;
          *pMVar12 = MVar15;
          local_210.mv_data = pMVar12;
          iVar5 = mdb_cursor_put(&local_1b8,&local_220,&local_210,0x40);
          *pMVar12 = MVar2;
          if (iVar5 != 0) break;
          MVar13 = MVar13 - MVar15;
          if (MVar13 == 0) {
            return 0;
          }
          iVar5 = mdb_cursor_next(&local_1b8,&local_220,&local_210,MDB_NEXT);
          if (iVar5 != 0) {
            return iVar5;
          }
        }
        return iVar5;
      }
      local_1f4 = local_1f4 + -1;
    }
    local_1f0 = MVar15 - uVar14;
    uVar14 = MVar13 - local_1f0;
    if (local_200 < 2 || (long)uVar14 <= lVar16) {
      if ((long)uVar14 < 1) {
        uVar14 = 0;
      }
    }
    else {
      uVar14 = (uVar14 / local_200 + lVar16) - (long)(uVar14 / local_200) % local_1d0;
    }
    local_220.mv_size = 8;
    local_220.mv_data = &local_200;
    local_210.mv_size = uVar14 * 8 + 8;
    iVar5 = mdb_cursor_put(&local_1b8,&local_220,&local_210,0x10000);
    if (iVar5 != 0) {
      return iVar5;
    }
    uVar7 = 0;
    if (lVar16 < (long)uVar14) {
      uVar7 = uVar14;
    }
    if ((local_1e4 & 0x1080000) != 0) {
      uVar7 = 0;
    }
    uVar8 = (long)uVar7 >> 0x3f & uVar7;
    memset((MDB_ID *)((long)local_210.mv_data + uVar8 * 8),0,(uVar7 - uVar8) * 8 + 8);
    MVar15 = local_1f0 + uVar14;
  } while( true );
}

Assistant:

static int
mdb_freelist_save(MDB_txn *txn)
{
	/* env->me_pghead[] can grow and shrink during this call.
	 * env->me_pglast and txn->mt_free_pgs[] can only grow.
	 * Page numbers cannot disappear from txn->mt_free_pgs[].
	 */
	MDB_cursor mc;
	MDB_env	*env = txn->mt_env;
	int rc, maxfree_1pg = env->me_maxfree_1pg, more = 1;
	txnid_t	pglast = 0, head_id = 0;
	pgno_t	freecnt = 0, *free_pgs, *mop;
	ssize_t	head_room = 0, total_room = 0, mop_len, clean_limit;

	mdb_cursor_init(&mc, txn, FREE_DBI, NULL);

	if (env->me_pghead) {
		/* Make sure first page of freeDB is touched and on freelist */
		rc = mdb_page_search(&mc, NULL, MDB_PS_FIRST|MDB_PS_MODIFY);
		if (rc && rc != MDB_NOTFOUND)
			return rc;
	}

	if (!env->me_pghead && txn->mt_loose_pgs) {
		/* Put loose page numbers in mt_free_pgs, since
		 * we may be unable to return them to me_pghead.
		 */
		MDB_page *mp = txn->mt_loose_pgs;
		if ((rc = mdb_midl_need(&txn->mt_free_pgs, txn->mt_loose_count)) != 0)
			return rc;
		for (; mp; mp = NEXT_LOOSE_PAGE(mp))
			mdb_midl_xappend(txn->mt_free_pgs, mp->mp_pgno);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
	}

	/* MDB_RESERVE cancels meminit in ovpage malloc (when no WRITEMAP) */
	clean_limit = (env->me_flags & (MDB_NOMEMINIT|MDB_WRITEMAP))
		? SSIZE_MAX : maxfree_1pg;

	for (;;) {
		/* Come back here after each Put() in case freelist changed */
		MDB_val key, data;
		pgno_t *pgs;
		ssize_t j;

		/* If using records from freeDB which we have not yet
		 * deleted, delete them and any we reserved for me_pghead.
		 */
		while (pglast < env->me_pglast) {
			rc = mdb_cursor_first(&mc, &key, NULL);
			if (rc)
				return rc;
			pglast = head_id = *(txnid_t *)key.mv_data;
			total_room = head_room = 0;
			mdb_tassert(txn, pglast <= env->me_pglast);
			rc = mdb_cursor_del(&mc, 0);
			if (rc)
				return rc;
		}

		/* Save the IDL of pages freed by this txn, to a single record */
		if (freecnt < txn->mt_free_pgs[0]) {
			if (!freecnt) {
				/* Make sure last page of freeDB is touched and on freelist */
				rc = mdb_page_search(&mc, NULL, MDB_PS_LAST|MDB_PS_MODIFY);
				if (rc && rc != MDB_NOTFOUND)
					return rc;
			}
			free_pgs = txn->mt_free_pgs;
			/* Write to last page of freeDB */
			key.mv_size = sizeof(txn->mt_txnid);
			key.mv_data = &txn->mt_txnid;
			do {
				freecnt = free_pgs[0];
				data.mv_size = MDB_IDL_SIZEOF(free_pgs);
				rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
				if (rc)
					return rc;
				/* Retry if mt_free_pgs[] grew during the Put() */
				free_pgs = txn->mt_free_pgs;
			} while (freecnt < free_pgs[0]);
			mdb_midl_sort(free_pgs);
			memcpy(data.mv_data, free_pgs, data.mv_size);
#if (MDB_DEBUG) > 1
			{
				unsigned int i = free_pgs[0];
				DPRINTF(("IDL write txn %"Y"u root %"Y"u num %u",
					txn->mt_txnid, txn->mt_dbs[FREE_DBI].md_root, i));
				for (; i; i--)
					DPRINTF(("IDL %"Y"u", free_pgs[i]));
			}
#endif
			continue;
		}

		mop = env->me_pghead;
		mop_len = (mop ? mop[0] : 0) + txn->mt_loose_count;

		/* Reserve records for me_pghead[]. Split it if multi-page,
		 * to avoid searching freeDB for a page range. Use keys in
		 * range [1,me_pglast]: Smaller than txnid of oldest reader.
		 */
		if (total_room >= mop_len) {
			if (total_room == mop_len || --more < 0)
				break;
		} else if (head_room >= maxfree_1pg && head_id > 1) {
			/* Keep current record (overflow page), add a new one */
			head_id--;
			head_room = 0;
		}
		/* (Re)write {key = head_id, IDL length = head_room} */
		total_room -= head_room;
		head_room = mop_len - total_room;
		if (head_room > maxfree_1pg && head_id > 1) {
			/* Overflow multi-page for part of me_pghead */
			head_room /= head_id; /* amortize page sizes */
			head_room += maxfree_1pg - head_room % (maxfree_1pg + 1);
		} else if (head_room < 0) {
			/* Rare case, not bothering to delete this record */
			head_room = 0;
		}
		key.mv_size = sizeof(head_id);
		key.mv_data = &head_id;
		data.mv_size = (head_room + 1) * sizeof(pgno_t);
		rc = mdb_cursor_put(&mc, &key, &data, MDB_RESERVE);
		if (rc)
			return rc;
		/* IDL is initially empty, zero out at least the length */
		pgs = (pgno_t *)data.mv_data;
		j = head_room > clean_limit ? head_room : 0;
		do {
			pgs[j] = 0;
		} while (--j >= 0);
		total_room += head_room;
	}

	/* Return loose page numbers to me_pghead, though usually none are
	 * left at this point.  The pages themselves remain in dirty_list.
	 */
	if (txn->mt_loose_pgs) {
		MDB_page *mp = txn->mt_loose_pgs;
		unsigned count = txn->mt_loose_count;
		MDB_IDL loose;
		/* Room for loose pages + temp IDL with same */
		if ((rc = mdb_midl_need(&env->me_pghead, 2*count+1)) != 0)
			return rc;
		mop = env->me_pghead;
		loose = mop + MDB_IDL_ALLOCLEN(mop) - count;
		for (count = 0; mp; mp = NEXT_LOOSE_PAGE(mp))
			loose[ ++count ] = mp->mp_pgno;
		loose[0] = count;
		mdb_midl_sort(loose);
		mdb_midl_xmerge(mop, loose);
		txn->mt_loose_pgs = NULL;
		txn->mt_loose_count = 0;
		mop_len = mop[0];
	}

	/* Fill in the reserved me_pghead records */
	rc = MDB_SUCCESS;
	if (mop_len) {
		MDB_val key, data;

		mop += mop_len;
		rc = mdb_cursor_first(&mc, &key, &data);
		for (; !rc; rc = mdb_cursor_next(&mc, &key, &data, MDB_NEXT)) {
			txnid_t id = *(txnid_t *)key.mv_data;
			ssize_t	len = (ssize_t)(data.mv_size / sizeof(MDB_ID)) - 1;
			MDB_ID save;

			mdb_tassert(txn, len >= 0 && id <= env->me_pglast);
			key.mv_data = &id;
			if (len > mop_len) {
				len = mop_len;
				data.mv_size = (len + 1) * sizeof(MDB_ID);
			}
			data.mv_data = mop -= len;
			save = mop[0];
			mop[0] = len;
			rc = mdb_cursor_put(&mc, &key, &data, MDB_CURRENT);
			mop[0] = save;
			if (rc || !(mop_len -= len))
				break;
		}
	}
	return rc;
}